

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemeditorfactory.cpp
# Opt level: O2

void __thiscall
QItemEditorFactory::registerEditor
          (QItemEditorFactory *this,int userType,QItemEditorCreatorBase *creator)

{
  Span *pSVar1;
  QItemEditorCreatorBase **ppQVar2;
  ulong uVar3;
  QHash<int,_QItemEditorCreatorBase_*> *this_00;
  long in_FS_OFFSET;
  const_iterator cVar4;
  QItemEditorCreatorBase *oldCreator;
  long *local_30;
  int local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->creatorMap;
  local_24 = userType;
  cVar4 = QHash<int,_QItemEditorCreatorBase_*>::constFindImpl<int>(this_00,&local_24);
  if (cVar4.i.d != (Data<QHashPrivate::Node<int,_QItemEditorCreatorBase_*>_> *)0x0 ||
      cVar4.i.bucket != 0) {
    pSVar1 = (cVar4.i.d)->spans;
    uVar3 = cVar4.i.bucket >> 7;
    local_30 = *(long **)(pSVar1[uVar3].entries[pSVar1[uVar3].offsets[(uint)cVar4.i.bucket & 0x7f]].
                          storage.data + 8);
    QHash<int,_QItemEditorCreatorBase_*>::erase(this_00,cVar4);
    cVar4 = QHash<int,_QItemEditorCreatorBase_*>::cbegin(this_00);
    cVar4 = std::
            __find_if<QHash<int,QItemEditorCreatorBase*>::const_iterator,__gnu_cxx::__ops::_Iter_equals_val<QItemEditorCreatorBase*const>>
                      (cVar4.i.d,cVar4.i.bucket,0,0,&local_30);
    if ((cVar4.i.bucket == 0 &&
         cVar4.i.d == (Data<QHashPrivate::Node<int,_QItemEditorCreatorBase_*>_> *)0x0) &&
       (local_30 != (long *)0x0)) {
      (**(code **)(*local_30 + 8))();
    }
  }
  ppQVar2 = QHash<int,_QItemEditorCreatorBase_*>::operator[](this_00,&local_24);
  *ppQVar2 = creator;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QItemEditorFactory::registerEditor(int userType, QItemEditorCreatorBase *creator)
{
    const auto it = creatorMap.constFind(userType);
    if (it != creatorMap.cend()) {
        QItemEditorCreatorBase *oldCreator = it.value();
        Q_ASSERT(oldCreator);
        creatorMap.erase(it);
        if (std::find(creatorMap.cbegin(), creatorMap.cend(), oldCreator) == creatorMap.cend())
            delete oldCreator; // if it is no more in use we can delete it
    }

    creatorMap[userType] = creator;
}